

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.h
# Opt level: O1

bool s_try_send<NetAction>(socket_t *socket,NetAction *value,int flags)

{
  bool bVar1;
  string_view payload;
  string msg;
  char *local_40;
  size_t local_38;
  char local_30;
  undefined7 uStack_2f;
  
  local_38 = 0;
  local_30 = '\0';
  local_40 = &local_30;
  std::__cxx11::string::resize((ulong)&local_40,'\x04');
  memcpy(local_40,value,local_38);
  payload._M_str = local_40;
  payload._M_len = local_38;
  bVar1 = s_send_raw(socket,payload,flags);
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  return bVar1;
}

Assistant:

bool s_try_send(zmq::socket_t *socket, const T &value, int flags = 0) {
    static_assert(is_transferable<T>::value, "Cannot transfer this type");
    std::string msg;
    msg.resize(sizeof(T));
    ::memcpy(msg.data(), &value, msg.size());

    return s_send_raw(socket, std::string_view(msg), flags);
}